

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateOptions
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  int iVar1;
  FileDescriptorProto *descriptor;
  bool bVar2;
  int iVar3;
  Edition EVar4;
  FileDescriptor *pFVar5;
  DescriptorStringView this_00;
  anon_class_16_2_fc8c62b8 local_58;
  VoidPtr local_48;
  Invoker<std::__cxx11::basic_string<char>_> local_40;
  string_view local_38;
  int local_24;
  FileDescriptorProto *pFStack_20;
  int i;
  FileDescriptorProto *proto_local;
  FileDescriptor *file_local;
  DescriptorBuilder *this_local;
  
  pFStack_20 = proto;
  proto_local = (FileDescriptorProto *)file;
  file_local = (FileDescriptor *)this;
  ValidateFileFeatures(this,file,proto);
  bVar2 = IsLite((FileDescriptor *)proto_local);
  if (!bVar2) {
    local_24 = 0;
    while( true ) {
      iVar1 = local_24;
      iVar3 = FileDescriptor::dependency_count((FileDescriptor *)proto_local);
      if (iVar3 <= iVar1) break;
      pFVar5 = FileDescriptor::dependency((FileDescriptor *)proto_local,local_24);
      bVar2 = IsLite(pFVar5);
      if (bVar2) {
        pFVar5 = FileDescriptor::dependency((FileDescriptor *)proto_local,local_24);
        this_00 = FileDescriptor::name_abi_cxx11_(pFVar5);
        local_38 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
        descriptor = pFStack_20;
        local_58.file = (FileDescriptor **)&proto_local;
        local_58.i = &local_24;
        absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptorProto_const&)::__0,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_48,&local_58);
        make_error.invoker_ = local_40;
        make_error.ptr_.obj = local_48.obj;
        AddError(this,local_38,&descriptor->super_Message,IMPORT,make_error);
        break;
      }
      local_24 = local_24 + 1;
    }
  }
  EVar4 = FileDescriptor::edition((FileDescriptor *)proto_local);
  if (EVar4 == EDITION_PROTO3) {
    ValidateProto3(this,(FileDescriptor *)proto_local,pFStack_20);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateOptions(const FileDescriptor* file,
                                        const FileDescriptorProto& proto) {
  ValidateFileFeatures(file, proto);

  // Lite files can only be imported by other Lite files.
  if (!IsLite(file)) {
    for (int i = 0; i < file->dependency_count(); i++) {
      if (IsLite(file->dependency(i))) {
        AddError(file->dependency(i)->name(), proto,
                 DescriptorPool::ErrorCollector::IMPORT, [&] {
                   return absl::StrCat(
                       "Files that do not use optimize_for = LITE_RUNTIME "
                       "cannot import files which do use this option.  This "
                       "file is not lite, but it imports \"",
                       file->dependency(i)->name(), "\" which is.");
                 });
        break;
      }
    }
  }
  if (file->edition() == Edition::EDITION_PROTO3) {
    ValidateProto3(file, proto);
  }
}